

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeEDSK.cpp
# Opt level: O1

int __thiscall FormatTypeEDSK::GetNbRevolutions(FormatTypeEDSK *this,int side,int track)

{
  byte bVar1;
  uint uVar2;
  Track *pTVar3;
  Sector *pSVar4;
  Sector *pSVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  
  pTVar3 = this->side_[side].tracks;
  uVar2 = pTVar3[track].nb_sector;
  if ((ulong)uVar2 == 0) {
    uVar9 = 1;
  }
  else {
    pSVar4 = pTVar3[track].sectors;
    pSVar5 = pTVar3[track].sectors;
    uVar9 = 1;
    lVar10 = 0;
    do {
      bVar1 = pSVar4->mfm_chrn[lVar10 + -0x15];
      uVar7 = (uint)*(ushort *)(pSVar4->mfm_chrn + lVar10 + -0x12);
      uVar6 = 0x80 << (bVar1 & 0x1f);
      if (0x18 < bVar1) {
        uVar6 = uVar7;
      }
      uVar8 = uVar7 / uVar6;
      if (uVar7 % uVar6 != 0) {
        uVar8 = 1;
      }
      if (uVar9 < uVar8) {
        uVar9 = uVar8;
      }
      *(uint *)(pSVar5->mfm_crc + lVar10 + 0x3c) = uVar8;
      lVar10 = lVar10 + 0x1d0;
    } while ((ulong)uVar2 * 0x1d0 - lVar10 != 0);
  }
  return uVar9;
}

Assistant:

int FormatTypeEDSK::GetNbRevolutions(int side, int track)
{
   unsigned int nb_computed_revolution = 1;
   for (unsigned int s = 0; s < side_[side].tracks[track].nb_sector; s++)
   {
      // - n datas of sector (512 by default)
      unsigned int size_of_track = side_[side].tracks[track].sectors[s].actual_size;
      unsigned int theorical_size = (0x80 << (side_[side].tracks[track].sectors[s].sector_size));

      // Do we have multiple read ?
      if (theorical_size == 0) theorical_size = size_of_track;

      unsigned int nb_read = (size_of_track / theorical_size);

      if (size_of_track % theorical_size != 0)
         nb_read = 1;

      side_[side].tracks[track].sectors[s].nb_recorded_revolutions = nb_read;
      if (nb_read > nb_computed_revolution) nb_computed_revolution = nb_read;
   }
   return nb_computed_revolution;
}